

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

void Term_queue_chars(wchar_t x,wchar_t y,wchar_t n,wchar_t a,wchar_t *s)

{
  int *piVar1;
  wchar_t *pwVar2;
  int *piVar3;
  wchar_t *pwVar4;
  wchar_t otc;
  wchar_t ota;
  wchar_t oc;
  wchar_t oa;
  wchar_t *scr_tcc;
  int *scr_taa;
  wchar_t *scr_cc;
  int *scr_aa;
  wchar_t x2;
  wchar_t x1;
  wchar_t *s_local;
  wchar_t a_local;
  wchar_t n_local;
  wchar_t y_local;
  wchar_t x_local;
  
  scr_aa._4_4_ = L'\xffffffff';
  scr_aa._0_4_ = L'\xffffffff';
  piVar1 = Term->scr->a[y];
  pwVar2 = Term->scr->c[y];
  piVar3 = Term->scr->ta[y];
  pwVar4 = Term->scr->tc[y];
  _x2 = s;
  n_local = x;
  for (s_local._4_4_ = n; s_local._4_4_ != L'\0'; s_local._4_4_ = s_local._4_4_ + L'\xffffffff') {
    if ((((piVar1[n_local] != a) || (pwVar2[n_local] != *_x2)) || (piVar3[n_local] != 0)) ||
       (pwVar4[n_local] != L'\0')) {
      piVar1[n_local] = a;
      pwVar2[n_local] = *_x2;
      piVar3[n_local] = 0;
      pwVar4[n_local] = L'\0';
      if (scr_aa._4_4_ < L'\0') {
        scr_aa._4_4_ = n_local;
      }
      scr_aa._0_4_ = n_local;
    }
    n_local = n_local + L'\x01';
    _x2 = _x2 + 1;
  }
  if (L'\xffffffff' < scr_aa._4_4_) {
    if (y < Term->y1) {
      Term->y1 = y;
    }
    if (Term->y2 < y) {
      Term->y2 = y;
    }
    if (scr_aa._4_4_ < Term->x1[y]) {
      Term->x1[y] = scr_aa._4_4_;
    }
    if (Term->x2[y] < (wchar_t)scr_aa) {
      Term->x2[y] = (wchar_t)scr_aa;
    }
  }
  return;
}

Assistant:

void Term_queue_chars(int x, int y, int n, int a, const wchar_t *s)
{
	int x1 = -1, x2 = -1;

	int *scr_aa = Term->scr->a[y];
	wchar_t *scr_cc = Term->scr->c[y];

	int *scr_taa = Term->scr->ta[y];
	wchar_t *scr_tcc = Term->scr->tc[y];

	/* Queue the attr/chars */
	for ( ; n; x++, s++, n--) {
		int oa = scr_aa[x];
		wchar_t oc = scr_cc[x];

		int ota = scr_taa[x];
		wchar_t otc = scr_tcc[x];

		/* Hack -- Ignore non-changes */
		if ((oa == a) && (oc == *s) && (ota == 0) && (otc == 0)) continue;

		/* Save the "literal" information */
		scr_aa[x] = a;
		scr_cc[x] = *s;

		scr_taa[x] = 0;
		scr_tcc[x] = 0;

		/* Note the "range" of window updates */
		if (x1 < 0) x1 = x;
		x2 = x;
	}

	/* Expand the "change area" as needed */
	if (x1 >= 0) {
		/* Check for new min/max row info */
		if (y < Term->y1) Term->y1 = y;
		if (y > Term->y2) Term->y2 = y;

		/* Check for new min/max col info in this row */
		if (x1 < Term->x1[y]) Term->x1[y] = x1;
		if (x2 > Term->x2[y]) Term->x2[y] = x2;
	}
}